

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void set_trap_graphic(wchar_t trap_idx,wchar_t light_idx,uint8_t attr,wchar_t ch)

{
  long lVar1;
  
  if (light_idx < L'\x04') {
    trap_x_attr[(uint)light_idx][trap_idx] = attr;
    trap_x_char[(uint)light_idx][trap_idx] = ch;
  }
  else {
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 8) {
      *(uint8_t *)(*(long *)((long)trap_x_attr + lVar1) + (long)trap_idx) = attr;
      *(wchar_t *)(*(long *)((long)trap_x_char + lVar1) + (long)trap_idx * 4) = ch;
    }
  }
  return;
}

Assistant:

static void set_trap_graphic(int trap_idx, int light_idx, uint8_t attr, wchar_t ch) {
	if (light_idx < LIGHTING_MAX) {
		trap_x_attr[light_idx][trap_idx] = attr;
		trap_x_char[light_idx][trap_idx] = ch;
	} else {
		for (light_idx = 0; light_idx < LIGHTING_MAX; light_idx++) {
			trap_x_attr[light_idx][trap_idx] = attr;
			trap_x_char[light_idx][trap_idx] = ch;
		}
	}
}